

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  reference pvVar3;
  undefined8 in_RCX;
  reference in_RDX;
  reference in_RSI;
  long *in_RDI;
  int ret;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  Mat reference_blob;
  int outh;
  int outw;
  int h;
  int w;
  allocator_type *in_stack_fffffffffffffde0;
  value_type *pvVar4;
  size_type in_stack_fffffffffffffde8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffdf0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_1b0 [2];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_180;
  value_type local_168;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  undefined8 local_110;
  reference local_108;
  reference local_100;
  value_type *local_f0;
  int local_e8;
  undefined4 local_e4;
  reference local_e0;
  reference local_d8;
  int local_c8;
  undefined4 local_c4;
  reference local_c0;
  reference local_b8;
  reference local_b0;
  int local_a8;
  undefined4 local_a4;
  reference local_a0;
  reference local_98;
  reference local_90;
  value_type *local_88;
  int local_68;
  undefined4 local_64;
  value_type *local_60;
  int local_58;
  undefined4 local_54;
  reference local_50;
  int local_48;
  undefined4 local_44;
  reference local_40;
  int local_38;
  undefined4 local_34;
  reference local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  void *local_10;
  
  local_114 = in_RSI->w;
  local_118 = in_RSI->h;
  local_11c = *(int *)((long)in_RDI + 0xdc);
  local_120 = (int)in_RDI[0x1c];
  if (in_RSI->dims == 1) {
    local_114 = 1;
    local_118 = 1;
  }
  if ((local_11c == 0) || (local_120 == 0)) {
    local_11c = (int)((float)local_114 * *(float *)((long)in_RDI + 0xd4));
    local_120 = (int)((float)local_118 * *(float *)(in_RDI + 0x1b));
  }
  local_f0 = &local_168;
  local_168.data = (void *)0x0;
  local_168.refcount = (int *)0x0;
  local_168.elemsize = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.d = 0;
  local_168.c = 0;
  local_168.cstep = 0;
  local_168.w = local_11c;
  local_168.h = local_120;
  local_110 = in_RCX;
  local_108 = in_RDX;
  local_100 = in_RSI;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x13dda53);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x13dda79);
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_180,0);
  local_a0 = local_100;
  local_98 = pvVar3;
  if (pvVar3 != local_100) {
    if (local_100->refcount != (int *)0x0) {
      piVar1 = local_100->refcount;
      local_a4 = 1;
      LOCK();
      local_a8 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_50 = pvVar3;
    if (pvVar3->refcount != (int *)0x0) {
      piVar1 = pvVar3->refcount;
      local_54 = 0xffffffff;
      LOCK();
      local_58 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_58 == 1) {
        if (pvVar3->allocator == (Allocator *)0x0) {
          local_18 = pvVar3->data;
          if (local_18 != (void *)0x0) {
            free(local_18);
          }
        }
        else {
          (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
        }
      }
    }
    pvVar3->data = (void *)0x0;
    pvVar3->elemsize = 0;
    pvVar3->elempack = 0;
    pvVar3->dims = 0;
    pvVar3->w = 0;
    pvVar3->h = 0;
    pvVar3->d = 0;
    pvVar3->c = 0;
    pvVar3->cstep = 0;
    pvVar3->refcount = (int *)0x0;
    pvVar3->data = local_a0->data;
    pvVar3->refcount = local_a0->refcount;
    pvVar3->elemsize = local_a0->elemsize;
    pvVar3->elempack = local_a0->elempack;
    pvVar3->allocator = local_a0->allocator;
    pvVar3->dims = local_a0->dims;
    pvVar3->w = local_a0->w;
    pvVar3->h = local_a0->h;
    pvVar3->d = local_a0->d;
    pvVar3->c = local_a0->c;
    pvVar3->cstep = local_a0->cstep;
  }
  local_90 = pvVar3;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_180,1);
  local_c0 = &local_168;
  local_b8 = pvVar3;
  if (pvVar3 != local_c0) {
    if (local_168.refcount != (int *)0x0) {
      local_c4 = 1;
      LOCK();
      local_c8 = *local_168.refcount;
      *local_168.refcount = *local_168.refcount + 1;
      UNLOCK();
    }
    local_40 = pvVar3;
    if (pvVar3->refcount != (int *)0x0) {
      piVar1 = pvVar3->refcount;
      local_44 = 0xffffffff;
      LOCK();
      local_48 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_48 == 1) {
        if (pvVar3->allocator == (Allocator *)0x0) {
          local_20 = pvVar3->data;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
        }
      }
    }
    pvVar3->data = (void *)0x0;
    pvVar3->elemsize = 0;
    pvVar3->elempack = 0;
    pvVar3->dims = 0;
    pvVar3->w = 0;
    pvVar3->h = 0;
    pvVar3->d = 0;
    pvVar3->c = 0;
    pvVar3->cstep = 0;
    pvVar3->refcount = (int *)0x0;
    pvVar3->data = local_c0->data;
    pvVar3->refcount = local_c0->refcount;
    pvVar3->elemsize = local_c0->elemsize;
    pvVar3->elempack = local_c0->elempack;
    pvVar3->allocator = local_c0->allocator;
    pvVar3->dims = local_c0->dims;
    pvVar3->w = local_c0->w;
    pvVar3->h = local_c0->h;
    pvVar3->d = local_c0->d;
    pvVar3->c = local_c0->c;
    pvVar3->cstep = local_c0->cstep;
  }
  local_b0 = pvVar3;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x13ddef3);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x13ddf19);
  iVar2 = (**(code **)(*in_RDI + 0x30))(in_RDI,&local_180,local_1b0,local_110);
  local_e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1b0,0);
  local_d8 = local_108;
  if (local_108 != local_e0) {
    if (local_e0->refcount != (int *)0x0) {
      piVar1 = local_e0->refcount;
      local_e4 = 1;
      LOCK();
      local_e8 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_30 = local_108;
    pvVar3 = local_108;
    if (local_108->refcount != (int *)0x0) {
      piVar1 = local_108->refcount;
      local_34 = 0xffffffff;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_38 == 1) {
        if (local_108->allocator == (Allocator *)0x0) {
          local_28 = local_108->data;
          if (local_28 != (void *)0x0) {
            free(local_28);
          }
        }
        else {
          (*local_108->allocator->_vptr_Allocator[3])(local_108->allocator,local_108->data);
        }
      }
    }
    local_108->data = (void *)0x0;
    local_108->elemsize = 0;
    local_108->elempack = 0;
    local_108->dims = 0;
    local_108->w = 0;
    local_108->h = 0;
    local_108->d = 0;
    local_108->c = 0;
    local_108->cstep = 0;
    local_108->refcount = (int *)0x0;
    pvVar3->data = local_e0->data;
    pvVar3->refcount = local_e0->refcount;
    pvVar3->elemsize = local_e0->elemsize;
    pvVar3->elempack = local_e0->elempack;
    pvVar3->allocator = local_e0->allocator;
    pvVar3->dims = local_e0->dims;
    pvVar3->w = local_e0->w;
    pvVar3->h = local_e0->h;
    pvVar3->d = local_e0->d;
    pvVar3->c = local_e0->c;
    pvVar3->cstep = local_e0->cstep;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffde0);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffde0);
  pvVar4 = &local_168;
  if (local_168.refcount != (int *)0x0) {
    local_64 = 0xffffffff;
    LOCK();
    local_68 = *local_168.refcount;
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (local_68 == 1) {
      local_88 = pvVar4;
      local_60 = pvVar4;
      if (local_168.allocator == (Allocator *)0x0) {
        local_10 = local_168.data;
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])(local_168.allocator,local_168.data);
      }
    }
  }
  pvVar4->data = (void *)0x0;
  pvVar4->elemsize = 0;
  pvVar4->elempack = 0;
  pvVar4->dims = 0;
  pvVar4->w = 0;
  pvVar4->h = 0;
  pvVar4->d = 0;
  pvVar4->c = 0;
  pvVar4->cstep = 0;
  pvVar4->refcount = (int *)0x0;
  return iVar2;
}

Assistant:

int Interp::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    int outw = output_width;
    int outh = output_height;
    if (bottom_blob.dims == 1)
    {
        w = 1;
        h = 1;
    }
    if (outw == 0 || outh == 0)
    {
        outw = static_cast<int>(w * width_scale);
        outh = static_cast<int>(h * height_scale);
    }

    Mat reference_blob;
    reference_blob.w = outw;
    reference_blob.h = outh;

    std::vector<Mat> bottom_blobs(2);
    bottom_blobs[0] = bottom_blob;
    bottom_blobs[1] = reference_blob;

    std::vector<Mat> top_blobs(1);

    int ret = forward(bottom_blobs, top_blobs, opt);

    top_blob = top_blobs[0];

    return ret;
}